

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint16_t FACTWaveBank_GetWaveIndex(FACTWaveBank *pWaveBank,char *szFriendlyName)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  char *curName;
  uint16_t i;
  ushort local_1a;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x50) != 0)) {
    FAudio_PlatformLockMutex((FAudioMutex)0x115202);
    for (local_1a = 0; (uint)local_1a < *(uint *)(in_RDI + 0x30); local_1a = local_1a + 1) {
      iVar1 = SDL_strncmp(in_RSI,in_RSI,0x40);
      if (iVar1 == 0) {
        FAudio_PlatformUnlockMutex((FAudioMutex)0x115252);
        return local_1a;
      }
    }
    FAudio_PlatformUnlockMutex((FAudioMutex)0x11528f);
  }
  return 0xffff;
}

Assistant:

uint16_t FACTWaveBank_GetWaveIndex(
	FACTWaveBank *pWaveBank,
	const char *szFriendlyName
) {
	uint16_t i;
	char *curName;
	if (pWaveBank == NULL || pWaveBank->waveBankNames == NULL)
	{
		return FACTINDEX_INVALID;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	curName = pWaveBank->waveBankNames;
	for (i = 0; i < pWaveBank->entryCount; i += 1, curName += 64)
	{
		if (FAudio_strncmp(szFriendlyName, curName, 64) == 0)
		{
			FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
			return i;
		}
	}
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);

	return FACTINDEX_INVALID;
}